

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

void stringIteratorSetState(UCharIterator *iter,uint32_t state,UErrorCode *pErrorCode)

{
  if ((pErrorCode == (UErrorCode *)0x0) || (U_ZERO_ERROR < *pErrorCode)) {
    return;
  }
  if (iter == (UCharIterator *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return;
  }
  if ((iter->start <= (int)state) && ((int)state <= iter->limit)) {
    iter->index = state;
    return;
  }
  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return;
}

Assistant:

static void U_CALLCONV
stringIteratorSetState(UCharIterator *iter, uint32_t state, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        /* do nothing */
    } else if(iter==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    } else if((int32_t)state<iter->start || iter->limit<(int32_t)state) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
    } else {
        iter->index=(int32_t)state;
    }
}